

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_modifiers.cpp
# Opt level: O0

bool __thiscall
icu_63::number::impl::ConstantMultiFieldModifier::semanticallyEquivalent
          (ConstantMultiFieldModifier *this,Modifier *other)

{
  bool bVar1;
  bool local_41;
  long local_40;
  ConstantMultiFieldModifier *_other;
  Modifier *other_local;
  ConstantMultiFieldModifier *this_local;
  
  if (other == (Modifier *)0x0) {
    local_40 = 0;
  }
  else {
    local_40 = __dynamic_cast(other,&Modifier::typeinfo,&typeinfo,0);
  }
  if (local_40 == 0) {
    this_local._7_1_ = false;
  }
  else if ((this->fParameters).obj == (ModifierStore *)0x0) {
    bVar1 = NumberStringBuilder::contentEquals(&this->fPrefix,(NumberStringBuilder *)(local_40 + 8))
    ;
    local_41 = false;
    if (bVar1) {
      bVar1 = NumberStringBuilder::contentEquals
                        (&this->fSuffix,(NumberStringBuilder *)(local_40 + 0x108));
      local_41 = false;
      if ((bVar1) &&
         (local_41 = false, (this->fOverwrite & 1U) == (*(byte *)(local_40 + 0x208) & 1))) {
        local_41 = (this->fStrong & 1U) == (*(byte *)(local_40 + 0x209) & 1);
      }
    }
    this_local._7_1_ = local_41;
  }
  else {
    this_local._7_1_ = (this->fParameters).obj == *(ModifierStore **)(local_40 + 0x210);
  }
  return this_local._7_1_;
}

Assistant:

bool ConstantMultiFieldModifier::semanticallyEquivalent(const Modifier& other) const {
    auto* _other = dynamic_cast<const ConstantMultiFieldModifier*>(&other);
    if (_other == nullptr) {
        return false;
    }
    if (fParameters.obj != nullptr) {
        return fParameters.obj == _other->fParameters.obj;
    }
    return fPrefix.contentEquals(_other->fPrefix)
        && fSuffix.contentEquals(_other->fSuffix)
        && fOverwrite == _other->fOverwrite
        && fStrong == _other->fStrong;
}